

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_16781328,_true,_embree::avx2::VirtualCurveIntersectorK<8>,_true>::
     occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined1 auVar1 [32];
  BVH *bvh;
  ulong uVar2;
  size_t k;
  RayQueryContext *pRVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  char cVar26;
  int iVar27;
  AABBNodeMB4D *node1;
  ulong uVar28;
  undefined8 *puVar29;
  uint uVar30;
  undefined4 uVar31;
  uint uVar32;
  ulong uVar33;
  RayQueryContext *pRVar34;
  long lVar35;
  ulong *puVar36;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar44 [16];
  NodeRef root;
  undefined1 (*pauVar37) [32];
  bool bVar38;
  undefined1 auVar42 [32];
  undefined1 auVar39 [16];
  undefined1 auVar43 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 in_ZMM5 [64];
  float fVar73;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  vfloat4 a0;
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  float fVar103;
  float fVar104;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar102 [32];
  float fVar113;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [64];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [64];
  vbool<8> terminated;
  vbool<8> valid_o;
  TravRayK<8,_true> tray;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  undefined8 local_5ce0;
  undefined8 uStack_5cd8;
  undefined8 uStack_5cd0;
  undefined8 uStack_5cc8;
  undefined1 local_5c80 [32];
  undefined8 local_5c60;
  undefined8 uStack_5c58;
  undefined8 uStack_5c50;
  undefined8 uStack_5c48;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5c40;
  undefined1 local_5be0 [32];
  undefined1 local_5bc0 [32];
  undefined1 local_5ba0 [8];
  float fStack_5b98;
  float fStack_5b94;
  float fStack_5b90;
  float fStack_5b8c;
  float fStack_5b88;
  undefined4 uStack_5b84;
  undefined1 local_5b80 [32];
  undefined1 local_5b60 [8];
  float fStack_5b58;
  float fStack_5b54;
  float fStack_5b50;
  float fStack_5b4c;
  float fStack_5b48;
  undefined1 local_5b40 [32];
  undefined1 local_5b20 [32];
  undefined1 local_5b00 [32];
  undefined1 local_5ae0 [32];
  undefined1 local_5ac0 [32];
  undefined1 local_5aa0 [32];
  undefined1 local_5a80 [32];
  undefined1 local_5a60 [32];
  undefined1 local_5a40 [32];
  undefined1 local_5a20 [32];
  undefined1 local_5a00 [32];
  float local_59e0;
  float fStack_59dc;
  float fStack_59d8;
  float fStack_59d4;
  float fStack_59d0;
  float fStack_59cc;
  float fStack_59c8;
  float fStack_59c4;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_59c0;
  undefined1 local_59a0 [16];
  undefined1 auStack_5990 [16];
  undefined1 auStack_5980 [368];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar49 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    auVar1 = *(undefined1 (*) [32])(ray + 0x100);
    auVar43 = vpcmpeqd_avx2(auVar49,(undefined1  [32])valid_i->field_0);
    auVar49 = vcmpps_avx(auVar1,ZEXT1632(ZEXT816(0) << 0x40),5);
    auVar49 = vandps_avx(auVar49,auVar43);
    uVar30 = vmovmskps_avx(auVar49);
    if (uVar30 != 0) {
      auVar39 = vpackssdw_avx(auVar49._0_16_,auVar49._16_16_);
      local_5be0 = *(undefined1 (*) [32])(ray + 0x80);
      local_5bc0 = *(undefined1 (*) [32])(ray + 0xa0);
      _local_5ba0 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar98._0_4_ = local_5ba0._0_4_ * local_5ba0._0_4_;
      auVar98._4_4_ = local_5ba0._4_4_ * local_5ba0._4_4_;
      auVar98._8_4_ = local_5ba0._8_4_ * local_5ba0._8_4_;
      auVar98._12_4_ = local_5ba0._12_4_ * local_5ba0._12_4_;
      auVar98._16_4_ = local_5ba0._16_4_ * local_5ba0._16_4_;
      auVar98._20_4_ = local_5ba0._20_4_ * local_5ba0._20_4_;
      auVar98._28_36_ = in_ZMM5._28_36_;
      auVar98._24_4_ = local_5ba0._24_4_ * local_5ba0._24_4_;
      auVar44 = vfmadd231ps_fma(auVar98._0_32_,local_5bc0,local_5bc0);
      auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),local_5be0,local_5be0);
      auVar49 = vrsqrtps_avx(ZEXT1632(auVar44));
      uVar33 = (ulong)(uVar30 & 0xff);
      fVar73 = auVar49._0_4_;
      fVar76 = auVar49._4_4_;
      fVar77 = auVar49._8_4_;
      fVar78 = auVar49._12_4_;
      fVar79 = auVar49._16_4_;
      fVar80 = auVar49._20_4_;
      fVar81 = auVar49._24_4_;
      auVar43._4_4_ = fVar76 * fVar76 * fVar76 * auVar44._4_4_ * -0.5;
      auVar43._0_4_ = fVar73 * fVar73 * fVar73 * auVar44._0_4_ * -0.5;
      auVar43._8_4_ = fVar77 * fVar77 * fVar77 * auVar44._8_4_ * -0.5;
      auVar43._12_4_ = fVar78 * fVar78 * fVar78 * auVar44._12_4_ * -0.5;
      auVar43._16_4_ = fVar79 * fVar79 * fVar79 * -0.0;
      auVar43._20_4_ = fVar80 * fVar80 * fVar80 * -0.0;
      auVar43._24_4_ = fVar81 * fVar81 * fVar81 * -0.0;
      auVar43._28_4_ = 0;
      auVar82._8_4_ = 0x3fc00000;
      auVar82._0_8_ = 0x3fc000003fc00000;
      auVar82._12_4_ = 0x3fc00000;
      auVar82._16_4_ = 0x3fc00000;
      auVar82._20_4_ = 0x3fc00000;
      auVar82._24_4_ = 0x3fc00000;
      auVar82._28_4_ = 0x3fc00000;
      auVar44 = vfmadd213ps_fma(auVar82,auVar49,auVar43);
      local_59c0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)ZEXT1632(auVar44);
      auVar67._8_4_ = 0x80000000;
      auVar67._0_8_ = 0x8000000080000000;
      auVar67._12_4_ = 0x80000000;
      auVar44._12_4_ = 0;
      auVar44._0_12_ = ZEXT812(0);
      auVar44 = auVar44 << 0x20;
      do {
        lVar35 = 0;
        for (uVar28 = uVar33; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
          lVar35 = lVar35 + 1;
        }
        uVar28 = (ulong)(uint)((int)lVar35 * 4);
        auVar88 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar28 + 0x80)),
                                ZEXT416(*(uint *)(ray + uVar28 + 0xa0)),0x1c);
        auVar88 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(ray + uVar28 + 0xc0)),0x28);
        fVar73 = *(float *)((long)&local_59c0 + uVar28);
        auVar91._0_4_ = auVar88._0_4_ * fVar73;
        auVar91._4_4_ = auVar88._4_4_ * fVar73;
        auVar91._8_4_ = auVar88._8_4_ * fVar73;
        auVar91._12_4_ = auVar88._12_4_ * fVar73;
        auVar96 = vshufpd_avx(auVar91,auVar91,1);
        auVar88 = vmovshdup_avx(auVar91);
        auVar94 = vunpckhps_avx(auVar91,auVar44);
        auVar93._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
        auVar93._8_8_ = auVar96._8_8_ ^ auVar67._8_8_;
        auVar93 = vinsertps_avx(auVar93,auVar91,0x2a);
        auVar94 = vshufps_avx(auVar94,ZEXT416(auVar88._0_4_ ^ 0x80000000),0x41);
        auVar88 = vdpps_avx(auVar93,auVar93,0x7f);
        auVar96 = vdpps_avx(auVar94,auVar94,0x7f);
        auVar88 = vcmpps_avx(auVar88,auVar96,1);
        auVar100._0_4_ = auVar88._0_4_;
        auVar100._4_4_ = auVar100._0_4_;
        auVar100._8_4_ = auVar100._0_4_;
        auVar100._12_4_ = auVar100._0_4_;
        auVar88 = vblendvps_avx(auVar93,auVar94,auVar100);
        auVar96 = vdpps_avx(auVar88,auVar88,0x7f);
        auVar93 = vrsqrtss_avx(auVar96,auVar96);
        fVar76 = auVar93._0_4_;
        fVar76 = fVar76 * 1.5 - auVar96._0_4_ * 0.5 * fVar76 * fVar76 * fVar76;
        auVar94._0_4_ = auVar88._0_4_ * fVar76;
        auVar94._4_4_ = auVar88._4_4_ * fVar76;
        auVar94._8_4_ = auVar88._8_4_ * fVar76;
        auVar94._12_4_ = auVar88._12_4_ * fVar76;
        auVar88 = vshufps_avx(auVar94,auVar94,0xc9);
        auVar96 = vshufps_avx(auVar91,auVar91,0xc9);
        auVar101._0_4_ = auVar94._0_4_ * auVar96._0_4_;
        auVar101._4_4_ = auVar94._4_4_ * auVar96._4_4_;
        auVar101._8_4_ = auVar94._8_4_ * auVar96._8_4_;
        auVar101._12_4_ = auVar94._12_4_ * auVar96._12_4_;
        auVar88 = vfmsub231ps_fma(auVar101,auVar91,auVar88);
        auVar93 = vshufps_avx(auVar88,auVar88,0xc9);
        auVar88 = vdpps_avx(auVar93,auVar93,0x7f);
        lVar35 = lVar35 * 0x30;
        auVar96 = vrsqrtss_avx(auVar88,auVar88);
        fVar76 = auVar96._0_4_;
        fVar76 = fVar76 * 1.5 - auVar88._0_4_ * 0.5 * fVar76 * fVar76 * fVar76;
        uVar33 = uVar33 - 1 & uVar33;
        auVar96._0_4_ = fVar76 * auVar93._0_4_;
        auVar96._4_4_ = fVar76 * auVar93._4_4_;
        auVar96._8_4_ = fVar76 * auVar93._8_4_;
        auVar96._12_4_ = fVar76 * auVar93._12_4_;
        auVar88._0_4_ = fVar73 * auVar91._0_4_;
        auVar88._4_4_ = fVar73 * auVar91._4_4_;
        auVar88._8_4_ = fVar73 * auVar91._8_4_;
        auVar88._12_4_ = fVar73 * auVar91._12_4_;
        auVar93 = vunpcklps_avx(auVar94,auVar88);
        auVar88 = vunpckhps_avx(auVar94,auVar88);
        auVar94 = vunpcklps_avx(auVar96,auVar44);
        auVar96 = vunpckhps_avx(auVar96,auVar44);
        auVar96 = vunpcklps_avx(auVar88,auVar96);
        auVar91 = vunpcklps_avx(auVar93,auVar94);
        auVar98 = ZEXT1664(auVar91);
        auVar88 = vunpckhps_avx(auVar93,auVar94);
        *(undefined1 (*) [16])(local_59a0 + lVar35) = auVar91;
        *(undefined1 (*) [16])(auStack_5990 + lVar35) = auVar88;
        *(undefined1 (*) [16])(auStack_5980 + lVar35) = auVar96;
      } while (uVar33 != 0);
      local_5c40._0_8_ = *(undefined8 *)ray;
      local_5c40._8_8_ = *(undefined8 *)(ray + 8);
      local_5c40._16_8_ = *(undefined8 *)(ray + 0x10);
      local_5c40._24_8_ = *(undefined8 *)(ray + 0x18);
      local_5c40._32_8_ = *(undefined8 *)(ray + 0x20);
      local_5c40._40_8_ = *(undefined8 *)(ray + 0x28);
      local_5c40._48_8_ = *(undefined8 *)(ray + 0x30);
      local_5c40._56_8_ = *(undefined8 *)(ray + 0x38);
      local_5c40._64_8_ = *(undefined8 *)(ray + 0x40);
      local_5c40._72_8_ = *(undefined8 *)(ray + 0x48);
      local_5c40._80_8_ = *(undefined8 *)(ray + 0x50);
      local_5c40._88_8_ = *(undefined8 *)(ray + 0x58);
      local_5a40._8_4_ = 0x7fffffff;
      local_5a40._0_8_ = 0x7fffffff7fffffff;
      local_5a40._12_4_ = 0x7fffffff;
      local_5a40._16_4_ = 0x7fffffff;
      local_5a40._20_4_ = 0x7fffffff;
      local_5a40._24_4_ = 0x7fffffff;
      local_5a40._28_4_ = 0x7fffffff;
      auVar89._8_4_ = 0x219392ef;
      auVar89._0_8_ = 0x219392ef219392ef;
      auVar89._12_4_ = 0x219392ef;
      auVar89._16_4_ = 0x219392ef;
      auVar89._20_4_ = 0x219392ef;
      auVar89._24_4_ = 0x219392ef;
      auVar89._28_4_ = 0x219392ef;
      auVar83._8_4_ = 0x3f800000;
      auVar83._0_8_ = &DAT_3f8000003f800000;
      auVar83._12_4_ = 0x3f800000;
      auVar83._16_4_ = 0x3f800000;
      auVar83._20_4_ = 0x3f800000;
      auVar83._24_4_ = 0x3f800000;
      auVar83._28_4_ = 0x3f800000;
      auVar49 = vandps_avx(local_5a40,local_5be0);
      auVar55 = vdivps_avx(auVar83,local_5be0);
      auVar43 = vcmpps_avx(auVar49,auVar89,1);
      auVar63 = vdivps_avx(auVar83,local_5bc0);
      auVar49 = vandps_avx(local_5a40,local_5bc0);
      auVar46 = vdivps_avx(auVar83,_local_5ba0);
      auVar82 = vcmpps_avx(auVar49,auVar89,1);
      auVar49 = vandps_avx(local_5a40,_local_5ba0);
      auVar86._8_4_ = 0x5d5e0b6b;
      auVar86._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar86._12_4_ = 0x5d5e0b6b;
      auVar86._16_4_ = 0x5d5e0b6b;
      auVar86._20_4_ = 0x5d5e0b6b;
      auVar86._24_4_ = 0x5d5e0b6b;
      auVar86._28_4_ = 0x5d5e0b6b;
      local_5b80 = vblendvps_avx(auVar55,auVar86,auVar43);
      _local_5b60 = vblendvps_avx(auVar63,auVar86,auVar82);
      auVar49 = vcmpps_avx(auVar49,auVar89,1);
      local_5b40 = vblendvps_avx(auVar46,auVar86,auVar49);
      auVar49 = vcmpps_avx(local_5b80,ZEXT832(0) << 0x20,1);
      auVar68._8_4_ = 0x20;
      auVar68._0_8_ = 0x2000000020;
      auVar68._12_4_ = 0x20;
      auVar68._16_4_ = 0x20;
      auVar68._20_4_ = 0x20;
      auVar68._24_4_ = 0x20;
      auVar68._28_4_ = 0x20;
      local_5b20 = vandps_avx(auVar49,auVar68);
      auVar63._8_4_ = 0x40;
      auVar63._0_8_ = 0x4000000040;
      auVar63._12_4_ = 0x40;
      auVar63._16_4_ = 0x40;
      auVar63._20_4_ = 0x40;
      auVar63._24_4_ = 0x40;
      auVar63._28_4_ = 0x40;
      auVar69._8_4_ = 0x60;
      auVar69._0_8_ = 0x6000000060;
      auVar69._12_4_ = 0x60;
      auVar69._16_4_ = 0x60;
      auVar69._20_4_ = 0x60;
      auVar69._24_4_ = 0x60;
      auVar69._28_4_ = 0x60;
      auVar49 = vcmpps_avx(_local_5b60,ZEXT832(0) << 0x20,5);
      local_5b00 = vblendvps_avx(auVar69,auVar63,auVar49);
      auVar55._8_4_ = 0x80;
      auVar55._0_8_ = 0x8000000080;
      auVar55._12_4_ = 0x80;
      auVar55._16_4_ = 0x80;
      auVar55._20_4_ = 0x80;
      auVar55._24_4_ = 0x80;
      auVar55._28_4_ = 0x80;
      auVar46._8_4_ = 0xa0;
      auVar46._0_8_ = 0xa0000000a0;
      auVar46._12_4_ = 0xa0;
      auVar46._16_4_ = 0xa0;
      auVar46._20_4_ = 0xa0;
      auVar46._24_4_ = 0xa0;
      auVar46._28_4_ = 0xa0;
      auVar43 = ZEXT832(0) << 0x20;
      auVar49 = vcmpps_avx(local_5b40,auVar43,5);
      local_5ae0 = vblendvps_avx(auVar46,auVar55,auVar49);
      auVar49 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar43);
      auVar1 = vmaxps_avx(auVar1,auVar43);
      local_5a60 = vpmovsxwd_avx2(auVar39);
      local_4680._8_4_ = 0x7f800000;
      local_4680._0_8_ = 0x7f8000007f800000;
      local_4680._12_4_ = 0x7f800000;
      local_4680._16_4_ = 0x7f800000;
      local_4680._20_4_ = 0x7f800000;
      local_4680._24_4_ = 0x7f800000;
      local_4680._28_4_ = 0x7f800000;
      auVar85 = ZEXT3264(local_4680);
      local_5ac0 = vblendvps_avx(local_4680,auVar49,local_5a60);
      auVar49._8_4_ = 0xff800000;
      auVar49._0_8_ = 0xff800000ff800000;
      auVar49._12_4_ = 0xff800000;
      auVar49._16_4_ = 0xff800000;
      auVar49._20_4_ = 0xff800000;
      auVar49._24_4_ = 0xff800000;
      auVar49._28_4_ = 0xff800000;
      local_5aa0 = vblendvps_avx(auVar49,auVar1,local_5a60);
      auVar44 = vpcmpeqd_avx(local_5aa0._0_16_,local_5aa0._0_16_);
      local_5c80 = vpmovsxwd_avx2(auVar39 ^ auVar44);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar30 = 7;
      }
      else {
        uVar30 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
      }
      pRVar34 = (RayQueryContext *)0x0;
      puVar36 = local_5800;
      local_5810 = 0xfffffffffffffff8;
      pauVar37 = (undefined1 (*) [32])local_4640;
      local_5808 = (bvh->root).ptr;
      local_5a80._16_16_ = mm_lookupmask_ps._0_16_;
      local_5a80._0_16_ = mm_lookupmask_ps._0_16_;
      local_4660 = local_5ac0;
      auVar116 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                    CONCAT424(0x3f7ffffa,
                                              CONCAT420(0x3f7ffffa,
                                                        CONCAT416(0x3f7ffffa,
                                                                  CONCAT412(0x3f7ffffa,
                                                                            CONCAT48(0x3f7ffffa,
                                                                                                                                                                          
                                                  0x3f7ffffa3f7ffffa)))))));
      auVar119 = ZEXT3264(CONCAT428(0x3f800003,
                                    CONCAT424(0x3f800003,
                                              CONCAT420(0x3f800003,
                                                        CONCAT416(0x3f800003,
                                                                  CONCAT412(0x3f800003,
                                                                            CONCAT48(0x3f800003,
                                                                                                                                                                          
                                                  0x3f8000033f800003)))))));
      do {
        pauVar37 = pauVar37 + -1;
        root.ptr = puVar36[-1];
        puVar36 = puVar36 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_0069cf15:
          iVar27 = 3;
        }
        else {
          auVar1 = *pauVar37;
          auVar49 = vcmpps_avx(auVar1,local_5aa0,1);
          if ((((((((auVar49 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar49 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar49 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar49 >> 0x7f,0) == '\0') &&
                (auVar49 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar49 >> 0xbf,0) == '\0') &&
              (auVar49 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar49[0x1f]) {
            iVar27 = 2;
          }
          else {
            uVar31 = vmovmskps_avx(auVar49);
            pRVar34 = (RayQueryContext *)CONCAT44((int)((ulong)pRVar34 >> 0x20),uVar31);
            iVar27 = 0;
            if ((uint)POPCOUNT(uVar31) <= uVar30) {
              for (; pRVar34 != (RayQueryContext *)0x0;
                  pRVar34 = (RayQueryContext *)
                            ((ulong)((long)&pRVar34[-1].args + 7U) & (ulong)pRVar34)) {
                k = 0;
                for (pRVar3 = pRVar34; ((ulong)pRVar3 & 1) == 0;
                    pRVar3 = (RayQueryContext *)((ulong)pRVar3 >> 1 | 0x8000000000000000)) {
                  k = k + 1;
                }
                auVar98 = ZEXT1664(auVar98._0_16_);
                bVar38 = occluded1(This,bvh,root,k,(Precalculations *)&local_59c0,ray,
                                   (TravRayK<8,_true> *)&local_5c40.field_0,context);
                if (bVar38) {
                  *(undefined4 *)(local_5c80 + k * 4) = 0xffffffff;
                }
                auVar85 = ZEXT3264(CONCAT428(0x7f800000,
                                             CONCAT424(0x7f800000,
                                                       CONCAT420(0x7f800000,
                                                                 CONCAT416(0x7f800000,
                                                                           CONCAT412(0x7f800000,
                                                                                     CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar116 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                              CONCAT424(0x3f7ffffa,
                                                        CONCAT420(0x3f7ffffa,
                                                                  CONCAT416(0x3f7ffffa,
                                                                            CONCAT412(0x3f7ffffa,
                                                                                      CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                auVar119 = ZEXT3264(CONCAT428(0x3f800003,
                                              CONCAT424(0x3f800003,
                                                        CONCAT420(0x3f800003,
                                                                  CONCAT416(0x3f800003,
                                                                            CONCAT412(0x3f800003,
                                                                                      CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
              }
              auVar49 = _DAT_0205a980 & ~local_5c80;
              iVar27 = 3;
              pRVar34 = (RayQueryContext *)0x0;
              if ((((((((auVar49 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar49 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar49 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar49 >> 0x7f,0) != '\0') ||
                    (auVar49 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar49 >> 0xbf,0) != '\0') ||
                  (auVar49 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar49[0x1f] < '\0') {
                auVar54._8_4_ = 0xff800000;
                auVar54._0_8_ = 0xff800000ff800000;
                auVar54._12_4_ = 0xff800000;
                auVar54._16_4_ = 0xff800000;
                auVar54._20_4_ = 0xff800000;
                auVar54._24_4_ = 0xff800000;
                auVar54._28_4_ = 0xff800000;
                local_5aa0 = vblendvps_avx(local_5aa0,auVar54,local_5c80);
                iVar27 = 2;
              }
            }
            auVar49 = local_5c80;
            auVar48 = ZEXT3264(auVar1);
            if (uVar30 < (uint)POPCOUNT(uVar31)) {
              do {
                if ((root.ptr & 8) != 0) {
                  if (root.ptr != 0xfffffffffffffff8) {
                    auVar1 = vcmpps_avx(local_5aa0,auVar48._0_32_,6);
                    if ((((((((auVar1 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar1 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar1 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar1 >> 0x7f,0) == '\0') &&
                          (auVar1 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar1 >> 0xbf,0) == '\0') &&
                        (auVar1 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar1[0x1f]) {
                      iVar27 = 2;
                    }
                    else {
                      pRVar34 = (RayQueryContext *)This->leafIntersector;
                      local_5c60 = local_5a80._0_8_;
                      uStack_5c58 = local_5a80._8_8_;
                      uStack_5c50 = local_5a80._16_8_;
                      uStack_5c48 = local_5a80._24_8_;
                      uVar32 = vmovmskps_avx(local_5c80);
                      if ((uVar32 ^ 0xff) != 0) {
                        uVar33 = (ulong)(byte)(uVar32 ^ 0xff);
                        puVar29 = (undefined8 *)
                                  ((long)pRVar34 +
                                  (ulong)*(byte *)(root.ptr & 0xfffffffffffffff0) * 0x40 + 0x28);
                        do {
                          lVar35 = 0;
                          for (uVar28 = uVar33; (uVar28 & 1) == 0;
                              uVar28 = uVar28 >> 1 | 0x8000000000000000) {
                            lVar35 = lVar35 + 1;
                          }
                          auVar98 = ZEXT1664(auVar98._0_16_);
                          pRVar34 = context;
                          cVar26 = (*(code *)*puVar29)(&local_59c0,ray,lVar35,context,
                                                       (byte *)(root.ptr & 0xfffffffffffffff0));
                          if (cVar26 != '\0') {
                            *(undefined4 *)((long)&local_5c60 + lVar35 * 4) = 0xffffffff;
                          }
                          uVar33 = uVar33 - 1 & uVar33;
                        } while (uVar33 != 0);
                      }
                      auVar1._8_8_ = uStack_5c58;
                      auVar1._0_8_ = local_5c60;
                      auVar1._16_8_ = uStack_5c50;
                      auVar1._24_8_ = uStack_5c48;
                      local_5c80 = vorps_avx(auVar49,auVar1);
                      auVar1 = _DAT_0205a980 & ~local_5c80;
                      if ((((((((auVar1 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                               (auVar1 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                              (auVar1 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             SUB321(auVar1 >> 0x7f,0) == '\0') &&
                            (auVar1 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar1 >> 0xbf,0) == '\0') &&
                          (auVar1 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar1[0x1f]) {
                        iVar27 = 3;
                      }
                      else {
                        auVar53._8_4_ = 0xff800000;
                        auVar53._0_8_ = 0xff800000ff800000;
                        auVar53._12_4_ = 0xff800000;
                        auVar53._16_4_ = 0xff800000;
                        auVar53._20_4_ = 0xff800000;
                        auVar53._24_4_ = 0xff800000;
                        auVar53._28_4_ = 0xff800000;
                        local_5aa0 = vblendvps_avx(local_5aa0,auVar53,local_5c80);
                        iVar27 = 0;
                      }
                    }
                    auVar85 = ZEXT3264(CONCAT428(0x7f800000,
                                                 CONCAT424(0x7f800000,
                                                           CONCAT420(0x7f800000,
                                                                     CONCAT416(0x7f800000,
                                                                               CONCAT412(0x7f800000,
                                                                                         CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                    auVar116 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                  CONCAT424(0x3f7ffffa,
                                                            CONCAT420(0x3f7ffffa,
                                                                      CONCAT416(0x3f7ffffa,
                                                                                CONCAT412(0x3f7ffffa
                                                                                          ,CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                    auVar119 = ZEXT3264(CONCAT428(0x3f800003,
                                                  CONCAT424(0x3f800003,
                                                            CONCAT420(0x3f800003,
                                                                      CONCAT416(0x3f800003,
                                                                                CONCAT412(0x3f800003
                                                                                          ,CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
                    break;
                  }
                  goto LAB_0069cf15;
                }
                uVar28 = root.ptr & 0xfffffffffffffff0;
                uVar32 = (uint)root.ptr & 7;
                auVar1 = vcmpps_avx(local_5aa0,auVar48._0_32_,6);
                auVar48 = ZEXT3264(auVar85._0_32_);
                uVar33 = 0;
                root.ptr = 8;
                do {
                  uVar2 = *(ulong *)(uVar28 + uVar33 * 8);
                  if (uVar2 != 8) {
                    auVar99._28_36_ = auVar98._28_36_;
                    if ((uVar32 == 6) || (uVar32 == 1)) {
                      uVar31 = *(undefined4 *)(uVar28 + 0x100 + uVar33 * 4);
                      auVar40._4_4_ = uVar31;
                      auVar40._0_4_ = uVar31;
                      auVar40._8_4_ = uVar31;
                      auVar40._12_4_ = uVar31;
                      auVar40._16_4_ = uVar31;
                      auVar40._20_4_ = uVar31;
                      auVar40._24_4_ = uVar31;
                      auVar40._28_4_ = uVar31;
                      uVar31 = *(undefined4 *)(uVar28 + 0x40 + uVar33 * 4);
                      auVar50._4_4_ = uVar31;
                      auVar50._0_4_ = uVar31;
                      auVar50._8_4_ = uVar31;
                      auVar50._12_4_ = uVar31;
                      auVar50._16_4_ = uVar31;
                      auVar50._20_4_ = uVar31;
                      auVar50._24_4_ = uVar31;
                      auVar50._28_4_ = uVar31;
                      auVar43 = *(undefined1 (*) [32])(ray + 0xe0);
                      uVar31 = *(undefined4 *)(uVar28 + 0x140 + uVar33 * 4);
                      auVar56._4_4_ = uVar31;
                      auVar56._0_4_ = uVar31;
                      auVar56._8_4_ = uVar31;
                      auVar56._12_4_ = uVar31;
                      auVar56._16_4_ = uVar31;
                      auVar56._20_4_ = uVar31;
                      auVar56._24_4_ = uVar31;
                      auVar56._28_4_ = uVar31;
                      auVar39 = vfmadd231ps_fma(auVar50,auVar43,auVar40);
                      uVar31 = *(undefined4 *)(uVar28 + 0x80 + uVar33 * 4);
                      auVar41._4_4_ = uVar31;
                      auVar41._0_4_ = uVar31;
                      auVar41._8_4_ = uVar31;
                      auVar41._12_4_ = uVar31;
                      auVar41._16_4_ = uVar31;
                      auVar41._20_4_ = uVar31;
                      auVar41._24_4_ = uVar31;
                      auVar41._28_4_ = uVar31;
                      auVar44 = vfmadd231ps_fma(auVar41,auVar43,auVar56);
                      uVar31 = *(undefined4 *)(uVar28 + 0x180 + uVar33 * 4);
                      auVar57._4_4_ = uVar31;
                      auVar57._0_4_ = uVar31;
                      auVar57._8_4_ = uVar31;
                      auVar57._12_4_ = uVar31;
                      auVar57._16_4_ = uVar31;
                      auVar57._20_4_ = uVar31;
                      auVar57._24_4_ = uVar31;
                      auVar57._28_4_ = uVar31;
                      uVar31 = *(undefined4 *)(uVar28 + 0xc0 + uVar33 * 4);
                      auVar64._4_4_ = uVar31;
                      auVar64._0_4_ = uVar31;
                      auVar64._8_4_ = uVar31;
                      auVar64._12_4_ = uVar31;
                      auVar64._16_4_ = uVar31;
                      auVar64._20_4_ = uVar31;
                      auVar64._24_4_ = uVar31;
                      auVar64._28_4_ = uVar31;
                      uVar31 = *(undefined4 *)(uVar28 + 0x120 + uVar33 * 4);
                      auVar70._4_4_ = uVar31;
                      auVar70._0_4_ = uVar31;
                      auVar70._8_4_ = uVar31;
                      auVar70._12_4_ = uVar31;
                      auVar70._16_4_ = uVar31;
                      auVar70._20_4_ = uVar31;
                      auVar70._24_4_ = uVar31;
                      auVar70._28_4_ = uVar31;
                      uVar31 = *(undefined4 *)(uVar28 + 0x60 + uVar33 * 4);
                      auVar74._4_4_ = uVar31;
                      auVar74._0_4_ = uVar31;
                      auVar74._8_4_ = uVar31;
                      auVar74._12_4_ = uVar31;
                      auVar74._16_4_ = uVar31;
                      auVar74._20_4_ = uVar31;
                      auVar74._24_4_ = uVar31;
                      auVar74._28_4_ = uVar31;
                      auVar67 = vfmadd231ps_fma(auVar64,auVar43,auVar57);
                      auVar88 = vfmadd231ps_fma(auVar74,auVar43,auVar70);
                      uVar31 = *(undefined4 *)(uVar28 + 0x160 + uVar33 * 4);
                      auVar58._4_4_ = uVar31;
                      auVar58._0_4_ = uVar31;
                      auVar58._8_4_ = uVar31;
                      auVar58._12_4_ = uVar31;
                      auVar58._16_4_ = uVar31;
                      auVar58._20_4_ = uVar31;
                      auVar58._24_4_ = uVar31;
                      auVar58._28_4_ = uVar31;
                      uVar31 = *(undefined4 *)(uVar28 + 0xa0 + uVar33 * 4);
                      auVar71._4_4_ = uVar31;
                      auVar71._0_4_ = uVar31;
                      auVar71._8_4_ = uVar31;
                      auVar71._12_4_ = uVar31;
                      auVar71._16_4_ = uVar31;
                      auVar71._20_4_ = uVar31;
                      auVar71._24_4_ = uVar31;
                      auVar71._28_4_ = uVar31;
                      uVar31 = *(undefined4 *)(uVar28 + 0x1a0 + uVar33 * 4);
                      auVar87._4_4_ = uVar31;
                      auVar87._0_4_ = uVar31;
                      auVar87._8_4_ = uVar31;
                      auVar87._12_4_ = uVar31;
                      auVar87._16_4_ = uVar31;
                      auVar87._20_4_ = uVar31;
                      auVar87._24_4_ = uVar31;
                      auVar87._28_4_ = uVar31;
                      auVar96 = vfmadd231ps_fma(auVar71,auVar43,auVar58);
                      uVar31 = *(undefined4 *)(uVar28 + 0xe0 + uVar33 * 4);
                      auVar59._4_4_ = uVar31;
                      auVar59._0_4_ = uVar31;
                      auVar59._8_4_ = uVar31;
                      auVar59._12_4_ = uVar31;
                      auVar59._16_4_ = uVar31;
                      auVar59._20_4_ = uVar31;
                      auVar59._24_4_ = uVar31;
                      auVar59._28_4_ = uVar31;
                      auVar93 = vfmadd231ps_fma(auVar59,auVar43,auVar87);
                      auVar20._8_8_ = local_5c40._8_8_;
                      auVar20._0_8_ = local_5c40._0_8_;
                      auVar20._16_8_ = local_5c40._16_8_;
                      auVar20._24_8_ = local_5c40._24_8_;
                      auVar22._8_8_ = local_5c40._40_8_;
                      auVar22._0_8_ = local_5c40._32_8_;
                      auVar22._16_8_ = local_5c40._48_8_;
                      auVar22._24_8_ = local_5c40._56_8_;
                      auVar24._8_8_ = local_5c40._72_8_;
                      auVar24._0_8_ = local_5c40._64_8_;
                      auVar24._16_8_ = local_5c40._80_8_;
                      auVar24._24_8_ = local_5c40._88_8_;
                      auVar82 = vsubps_avx(ZEXT1632(auVar39),auVar20);
                      auVar99._0_4_ = local_5b80._0_4_ * auVar82._0_4_;
                      auVar99._4_4_ = local_5b80._4_4_ * auVar82._4_4_;
                      auVar99._8_4_ = local_5b80._8_4_ * auVar82._8_4_;
                      auVar99._12_4_ = local_5b80._12_4_ * auVar82._12_4_;
                      auVar99._16_4_ = local_5b80._16_4_ * auVar82._16_4_;
                      auVar99._20_4_ = local_5b80._20_4_ * auVar82._20_4_;
                      auVar99._24_4_ = local_5b80._24_4_ * auVar82._24_4_;
                      auVar63 = auVar99._0_32_;
                      auVar98 = ZEXT3264(auVar63);
                      auVar82 = vsubps_avx(ZEXT1632(auVar44),auVar22);
                      auVar4._4_4_ = auVar82._4_4_ * (float)local_5b60._4_4_;
                      auVar4._0_4_ = auVar82._0_4_ * (float)local_5b60._0_4_;
                      auVar4._8_4_ = auVar82._8_4_ * fStack_5b58;
                      auVar4._12_4_ = auVar82._12_4_ * fStack_5b54;
                      auVar4._16_4_ = auVar82._16_4_ * fStack_5b50;
                      auVar4._20_4_ = auVar82._20_4_ * fStack_5b4c;
                      auVar4._24_4_ = auVar82._24_4_ * fStack_5b48;
                      auVar4._28_4_ = auVar82._28_4_;
                      auVar82 = vsubps_avx(ZEXT1632(auVar67),auVar24);
                      auVar5._4_4_ = local_5b40._4_4_ * auVar82._4_4_;
                      auVar5._0_4_ = local_5b40._0_4_ * auVar82._0_4_;
                      auVar5._8_4_ = local_5b40._8_4_ * auVar82._8_4_;
                      auVar5._12_4_ = local_5b40._12_4_ * auVar82._12_4_;
                      auVar5._16_4_ = local_5b40._16_4_ * auVar82._16_4_;
                      auVar5._20_4_ = local_5b40._20_4_ * auVar82._20_4_;
                      auVar5._24_4_ = local_5b40._24_4_ * auVar82._24_4_;
                      auVar5._28_4_ = auVar82._28_4_;
                      auVar82 = vsubps_avx(ZEXT1632(auVar88),auVar20);
                      auVar6._4_4_ = local_5b80._4_4_ * auVar82._4_4_;
                      auVar6._0_4_ = local_5b80._0_4_ * auVar82._0_4_;
                      auVar6._8_4_ = local_5b80._8_4_ * auVar82._8_4_;
                      auVar6._12_4_ = local_5b80._12_4_ * auVar82._12_4_;
                      auVar6._16_4_ = local_5b80._16_4_ * auVar82._16_4_;
                      auVar6._20_4_ = local_5b80._20_4_ * auVar82._20_4_;
                      auVar6._24_4_ = local_5b80._24_4_ * auVar82._24_4_;
                      auVar6._28_4_ = auVar82._28_4_;
                      auVar82 = vsubps_avx(ZEXT1632(auVar96),auVar22);
                      auVar7._4_4_ = auVar82._4_4_ * (float)local_5b60._4_4_;
                      auVar7._0_4_ = auVar82._0_4_ * (float)local_5b60._0_4_;
                      auVar7._8_4_ = auVar82._8_4_ * fStack_5b58;
                      auVar7._12_4_ = auVar82._12_4_ * fStack_5b54;
                      auVar7._16_4_ = auVar82._16_4_ * fStack_5b50;
                      auVar7._20_4_ = auVar82._20_4_ * fStack_5b4c;
                      auVar7._24_4_ = auVar82._24_4_ * fStack_5b48;
                      auVar7._28_4_ = auVar82._28_4_;
                      auVar82 = vsubps_avx(ZEXT1632(auVar93),auVar24);
                      auVar60._0_4_ = local_5b40._0_4_ * auVar82._0_4_;
                      auVar60._4_4_ = local_5b40._4_4_ * auVar82._4_4_;
                      auVar60._8_4_ = local_5b40._8_4_ * auVar82._8_4_;
                      auVar60._12_4_ = local_5b40._12_4_ * auVar82._12_4_;
                      auVar60._16_4_ = local_5b40._16_4_ * auVar82._16_4_;
                      auVar60._20_4_ = local_5b40._20_4_ * auVar82._20_4_;
                      auVar60._24_4_ = local_5b40._24_4_ * auVar82._24_4_;
                      auVar60._28_4_ = 0;
                      auVar82 = vpminsd_avx2(auVar63,auVar6);
                      auVar55 = vpminsd_avx2(auVar4,auVar7);
                      auVar82 = vpmaxsd_avx2(auVar82,auVar55);
                      auVar55 = vpminsd_avx2(auVar5,auVar60);
                      auVar82 = vpmaxsd_avx2(auVar82,auVar55);
                      auVar52._4_4_ = auVar116._4_4_ * auVar82._4_4_;
                      auVar52._0_4_ = auVar116._0_4_ * auVar82._0_4_;
                      auVar52._8_4_ = auVar116._8_4_ * auVar82._8_4_;
                      auVar52._12_4_ = auVar116._12_4_ * auVar82._12_4_;
                      auVar52._16_4_ = auVar116._16_4_ * auVar82._16_4_;
                      auVar52._20_4_ = auVar116._20_4_ * auVar82._20_4_;
                      auVar52._24_4_ = auVar116._24_4_ * auVar82._24_4_;
                      auVar52._28_4_ = auVar82._28_4_;
                      auVar82 = vpmaxsd_avx2(auVar63,auVar6);
                      auVar55 = vpmaxsd_avx2(auVar4,auVar7);
                      auVar55 = vpminsd_avx2(auVar82,auVar55);
                      auVar82 = vpmaxsd_avx2(auVar5,auVar60);
                      auVar82 = vpminsd_avx2(auVar55,auVar82);
                      auVar8._4_4_ = auVar119._4_4_ * auVar82._4_4_;
                      auVar8._0_4_ = auVar119._0_4_ * auVar82._0_4_;
                      auVar8._8_4_ = auVar119._8_4_ * auVar82._8_4_;
                      auVar8._12_4_ = auVar119._12_4_ * auVar82._12_4_;
                      auVar8._16_4_ = auVar119._16_4_ * auVar82._16_4_;
                      auVar8._20_4_ = auVar119._20_4_ * auVar82._20_4_;
                      auVar8._24_4_ = auVar119._24_4_ * auVar82._24_4_;
                      auVar8._28_4_ = auVar82._28_4_;
                      auVar82 = vpmaxsd_avx2(auVar52,local_5ac0);
                      auVar55 = vpminsd_avx2(auVar8,local_5aa0);
                      auVar82 = vcmpps_avx(auVar82,auVar55,2);
                      if (uVar32 != 6) goto LAB_0069ccfc;
                      uVar31 = *(undefined4 *)(uVar28 + 0x1c0 + uVar33 * 4);
                      auVar61._4_4_ = uVar31;
                      auVar61._0_4_ = uVar31;
                      auVar61._8_4_ = uVar31;
                      auVar61._12_4_ = uVar31;
                      auVar61._16_4_ = uVar31;
                      auVar61._20_4_ = uVar31;
                      auVar61._24_4_ = uVar31;
                      auVar61._28_4_ = uVar31;
                      auVar55 = vcmpps_avx(auVar61,auVar43,2);
                      uVar31 = *(undefined4 *)(uVar28 + 0x1e0 + uVar33 * 4);
                      auVar65._4_4_ = uVar31;
                      auVar65._0_4_ = uVar31;
                      auVar65._8_4_ = uVar31;
                      auVar65._12_4_ = uVar31;
                      auVar65._16_4_ = uVar31;
                      auVar65._20_4_ = uVar31;
                      auVar65._24_4_ = uVar31;
                      auVar65._28_4_ = uVar31;
                      auVar43 = vcmpps_avx(auVar43,auVar65,1);
                      auVar43 = vandps_avx(auVar55,auVar43);
                      auVar43 = vandps_avx(auVar43,auVar82);
                      auVar39 = auVar43._0_16_;
                      auVar44 = auVar43._16_16_;
                    }
                    else {
                      uVar31 = *(undefined4 *)(uVar28 + 0x40 + uVar33 * 4);
                      auVar75._4_4_ = uVar31;
                      auVar75._0_4_ = uVar31;
                      auVar75._8_4_ = uVar31;
                      auVar75._12_4_ = uVar31;
                      auVar75._16_4_ = uVar31;
                      auVar75._20_4_ = uVar31;
                      auVar75._24_4_ = uVar31;
                      auVar75._28_4_ = uVar31;
                      uVar31 = *(undefined4 *)(uVar28 + 0x60 + uVar33 * 4);
                      local_5a20._4_4_ = uVar31;
                      local_5a20._0_4_ = uVar31;
                      local_5a20._8_4_ = uVar31;
                      local_5a20._12_4_ = uVar31;
                      local_5a20._16_4_ = uVar31;
                      local_5a20._20_4_ = uVar31;
                      local_5a20._24_4_ = uVar31;
                      local_5a20._28_4_ = uVar31;
                      uVar31 = *(undefined4 *)(uVar28 + 0x80 + uVar33 * 4);
                      local_5a00._4_4_ = uVar31;
                      local_5a00._0_4_ = uVar31;
                      local_5a00._8_4_ = uVar31;
                      local_5a00._12_4_ = uVar31;
                      local_5a00._16_4_ = uVar31;
                      local_5a00._20_4_ = uVar31;
                      local_5a00._24_4_ = uVar31;
                      local_5a00._28_4_ = uVar31;
                      uVar31 = *(undefined4 *)(uVar28 + 0xa0 + uVar33 * 4);
                      auVar97._4_4_ = uVar31;
                      auVar97._0_4_ = uVar31;
                      auVar97._8_4_ = uVar31;
                      auVar97._12_4_ = uVar31;
                      auVar97._16_4_ = uVar31;
                      auVar97._20_4_ = uVar31;
                      auVar97._24_4_ = uVar31;
                      auVar97._28_4_ = uVar31;
                      uVar31 = *(undefined4 *)(uVar28 + 0xc0 + uVar33 * 4);
                      auVar95._4_4_ = uVar31;
                      auVar95._0_4_ = uVar31;
                      auVar95._8_4_ = uVar31;
                      auVar95._12_4_ = uVar31;
                      auVar95._16_4_ = uVar31;
                      auVar95._20_4_ = uVar31;
                      auVar95._24_4_ = uVar31;
                      auVar95._28_4_ = uVar31;
                      uVar31 = *(undefined4 *)(uVar28 + 0xe0 + uVar33 * 4);
                      auVar92._4_4_ = uVar31;
                      auVar92._0_4_ = uVar31;
                      auVar92._8_4_ = uVar31;
                      auVar92._12_4_ = uVar31;
                      auVar92._16_4_ = uVar31;
                      auVar92._20_4_ = uVar31;
                      auVar92._24_4_ = uVar31;
                      auVar92._28_4_ = uVar31;
                      fVar73 = *(float *)(uVar28 + 0x100 + uVar33 * 4);
                      auVar102._4_4_ = fVar73;
                      auVar102._0_4_ = fVar73;
                      auVar102._8_4_ = fVar73;
                      auVar102._12_4_ = fVar73;
                      auVar102._16_4_ = fVar73;
                      auVar102._20_4_ = fVar73;
                      auVar102._24_4_ = fVar73;
                      auVar102._28_4_ = fVar73;
                      fVar76 = *(float *)(uVar28 + 0x120 + uVar33 * 4);
                      auVar114._4_4_ = fVar76;
                      auVar114._0_4_ = fVar76;
                      auVar114._8_4_ = fVar76;
                      auVar114._12_4_ = fVar76;
                      auVar114._16_4_ = fVar76;
                      auVar114._20_4_ = fVar76;
                      auVar114._24_4_ = fVar76;
                      auVar114._28_4_ = fVar76;
                      fVar77 = *(float *)(uVar28 + 0x140 + uVar33 * 4);
                      auVar117._4_4_ = fVar77;
                      auVar117._0_4_ = fVar77;
                      auVar117._8_4_ = fVar77;
                      auVar117._12_4_ = fVar77;
                      auVar117._16_4_ = fVar77;
                      auVar117._20_4_ = fVar77;
                      auVar117._24_4_ = fVar77;
                      auVar117._28_4_ = fVar77;
                      uVar31 = *(undefined4 *)(uVar28 + 0x160 + uVar33 * 4);
                      auVar62._4_4_ = uVar31;
                      auVar62._0_4_ = uVar31;
                      auVar62._8_4_ = uVar31;
                      auVar62._12_4_ = uVar31;
                      auVar62._16_4_ = uVar31;
                      auVar62._20_4_ = uVar31;
                      auVar62._24_4_ = uVar31;
                      auVar62._28_4_ = uVar31;
                      uVar31 = *(undefined4 *)(uVar28 + 0x180 + uVar33 * 4);
                      auVar90._4_4_ = uVar31;
                      auVar90._0_4_ = uVar31;
                      auVar90._8_4_ = uVar31;
                      auVar90._12_4_ = uVar31;
                      auVar90._16_4_ = uVar31;
                      auVar90._20_4_ = uVar31;
                      auVar90._24_4_ = uVar31;
                      auVar90._28_4_ = uVar31;
                      uVar31 = *(undefined4 *)(uVar28 + 0x1a0 + uVar33 * 4);
                      auVar72._4_4_ = uVar31;
                      auVar72._0_4_ = uVar31;
                      auVar72._8_4_ = uVar31;
                      auVar72._12_4_ = uVar31;
                      auVar72._16_4_ = uVar31;
                      auVar72._20_4_ = uVar31;
                      auVar72._24_4_ = uVar31;
                      auVar72._28_4_ = uVar31;
                      fVar78 = *(float *)(uVar28 + 0x1c0 + uVar33 * 4);
                      fVar79 = *(float *)(uVar28 + 0x1e0 + uVar33 * 4);
                      local_59e0 = *(float *)(uVar28 + 0x200 + uVar33 * 4);
                      auVar25._8_8_ = local_5c40._72_8_;
                      auVar25._0_8_ = local_5c40._64_8_;
                      auVar25._16_8_ = local_5c40._80_8_;
                      auVar25._24_8_ = local_5c40._88_8_;
                      auVar39 = vfmadd231ps_fma(auVar62,auVar25,auVar102);
                      auVar44 = vfmadd231ps_fma(auVar90,auVar25,auVar114);
                      auVar67 = vfmadd231ps_fma(auVar72,auVar25,auVar117);
                      auVar9._4_4_ = fVar73 * (float)local_5ba0._4_4_;
                      auVar9._0_4_ = fVar73 * (float)local_5ba0._0_4_;
                      auVar9._8_4_ = fVar73 * fStack_5b98;
                      auVar9._12_4_ = fVar73 * fStack_5b94;
                      auVar9._16_4_ = fVar73 * fStack_5b90;
                      auVar9._20_4_ = fVar73 * fStack_5b8c;
                      auVar9._24_4_ = fVar73 * fStack_5b88;
                      auVar9._28_4_ = fVar73;
                      auVar10._4_4_ = fVar76 * (float)local_5ba0._4_4_;
                      auVar10._0_4_ = fVar76 * (float)local_5ba0._0_4_;
                      auVar10._8_4_ = fVar76 * fStack_5b98;
                      auVar10._12_4_ = fVar76 * fStack_5b94;
                      auVar10._16_4_ = fVar76 * fStack_5b90;
                      auVar10._20_4_ = fVar76 * fStack_5b8c;
                      auVar10._24_4_ = fVar76 * fStack_5b88;
                      auVar10._28_4_ = fVar76;
                      auVar11._4_4_ = fVar77 * (float)local_5ba0._4_4_;
                      auVar11._0_4_ = fVar77 * (float)local_5ba0._0_4_;
                      auVar11._8_4_ = fVar77 * fStack_5b98;
                      auVar11._12_4_ = fVar77 * fStack_5b94;
                      auVar11._16_4_ = fVar77 * fStack_5b90;
                      auVar11._20_4_ = fVar77 * fStack_5b8c;
                      auVar11._24_4_ = fVar77 * fStack_5b88;
                      auVar11._28_4_ = uStack_5b84;
                      auVar88 = vfmadd231ps_fma(auVar9,local_5bc0,auVar97);
                      auVar96 = vfmadd231ps_fma(auVar10,local_5bc0,auVar95);
                      auVar93 = vfmadd231ps_fma(auVar11,auVar92,local_5bc0);
                      fVar73 = *(float *)(uVar28 + 0x220 + uVar33 * 4);
                      auVar23._8_8_ = local_5c40._40_8_;
                      auVar23._0_8_ = local_5c40._32_8_;
                      auVar23._16_8_ = local_5c40._48_8_;
                      auVar23._24_8_ = local_5c40._56_8_;
                      auVar39 = vfmadd231ps_fma(ZEXT1632(auVar39),auVar23,auVar97);
                      auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar23,auVar95);
                      fVar76 = *(float *)(uVar28 + 0x240 + uVar33 * 4);
                      auVar67 = vfmadd231ps_fma(ZEXT1632(auVar67),auVar23,auVar92);
                      fVar77 = *(float *)(uVar28 + 0x260 + uVar33 * 4);
                      auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),local_5be0,auVar75);
                      auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),local_5be0,local_5a20);
                      auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),local_5a00,local_5be0);
                      auVar43 = vandps_avx(ZEXT1632(auVar88),local_5a40);
                      auVar45._8_4_ = 0x219392ef;
                      auVar45._0_8_ = 0x219392ef219392ef;
                      auVar45._12_4_ = 0x219392ef;
                      auVar45._16_4_ = 0x219392ef;
                      auVar45._20_4_ = 0x219392ef;
                      auVar45._24_4_ = 0x219392ef;
                      auVar45._28_4_ = 0x219392ef;
                      auVar43 = vcmpps_avx(auVar43,auVar45,1);
                      auVar82 = vblendvps_avx(ZEXT1632(auVar88),auVar45,auVar43);
                      auVar43 = vandps_avx(ZEXT1632(auVar96),local_5a40);
                      auVar43 = vcmpps_avx(auVar43,auVar45,1);
                      auVar55 = vblendvps_avx(ZEXT1632(auVar96),auVar45,auVar43);
                      auVar43 = vandps_avx(local_5a40,ZEXT1632(auVar93));
                      auVar46 = vcmpps_avx(auVar43,auVar45,1);
                      auVar63 = vblendvps_avx(ZEXT1632(auVar93),auVar45,auVar46);
                      auVar43 = *(undefined1 (*) [32])(ray + 0xe0);
                      fVar80 = auVar43._0_4_;
                      auVar115._0_4_ = fVar80 * fVar78;
                      fVar81 = auVar43._4_4_;
                      auVar115._4_4_ = fVar81 * fVar78;
                      fVar103 = auVar43._8_4_;
                      auVar115._8_4_ = fVar103 * fVar78;
                      fVar105 = auVar43._12_4_;
                      auVar115._12_4_ = fVar105 * fVar78;
                      fVar107 = auVar43._16_4_;
                      auVar115._16_4_ = fVar107 * fVar78;
                      fVar109 = auVar43._20_4_;
                      auVar115._20_4_ = fVar109 * fVar78;
                      fVar111 = auVar43._24_4_;
                      auVar115._24_4_ = fVar111 * fVar78;
                      auVar115._28_4_ = 0;
                      auVar12._4_4_ = fVar79 * fVar81;
                      auVar12._0_4_ = fVar79 * fVar80;
                      auVar12._8_4_ = fVar79 * fVar103;
                      auVar12._12_4_ = fVar79 * fVar105;
                      auVar12._16_4_ = fVar79 * fVar107;
                      auVar12._20_4_ = fVar79 * fVar109;
                      auVar12._24_4_ = fVar79 * fVar111;
                      auVar12._28_4_ = auVar46._28_4_;
                      auVar13._4_4_ = fVar81 * local_59e0;
                      auVar13._0_4_ = fVar80 * local_59e0;
                      auVar13._8_4_ = fVar103 * local_59e0;
                      auVar13._12_4_ = fVar105 * local_59e0;
                      auVar13._16_4_ = fVar107 * local_59e0;
                      auVar13._20_4_ = fVar109 * local_59e0;
                      auVar13._24_4_ = fVar111 * local_59e0;
                      auVar13._28_4_ = fVar79;
                      auVar51._8_4_ = 0x3f800000;
                      auVar51._0_8_ = &DAT_3f8000003f800000;
                      auVar51._12_4_ = 0x3f800000;
                      auVar51._16_4_ = 0x3f800000;
                      auVar51._20_4_ = 0x3f800000;
                      auVar51._24_4_ = 0x3f800000;
                      auVar51._28_4_ = 0x3f800000;
                      auVar43 = vsubps_avx(auVar51,auVar43);
                      auVar46 = ZEXT1232(ZEXT812(0)) << 0x20;
                      auVar88 = vfmadd231ps_fma(auVar115,auVar43,auVar46);
                      auVar96 = vfmadd231ps_fma(auVar12,auVar43,auVar46);
                      auVar98 = ZEXT1664(auVar96);
                      auVar93 = vfmadd231ps_fma(auVar13,auVar43,ZEXT1232(ZEXT812(0)) << 0x20);
                      fVar78 = auVar43._0_4_;
                      auVar118._0_4_ = fVar78 + fVar73 * fVar80;
                      fVar79 = auVar43._4_4_;
                      auVar118._4_4_ = fVar79 + fVar73 * fVar81;
                      fVar104 = auVar43._8_4_;
                      auVar118._8_4_ = fVar104 + fVar73 * fVar103;
                      fVar106 = auVar43._12_4_;
                      auVar118._12_4_ = fVar106 + fVar73 * fVar105;
                      fVar108 = auVar43._16_4_;
                      auVar118._16_4_ = fVar108 + fVar73 * fVar107;
                      fVar110 = auVar43._20_4_;
                      auVar118._20_4_ = fVar110 + fVar73 * fVar109;
                      fVar112 = auVar43._24_4_;
                      auVar118._24_4_ = fVar112 + fVar73 * fVar111;
                      fVar113 = auVar43._28_4_;
                      auVar118._28_4_ = fVar113 + fVar73;
                      auVar66._0_4_ = fVar78 + fVar80 * fVar76;
                      auVar66._4_4_ = fVar79 + fVar81 * fVar76;
                      auVar66._8_4_ = fVar104 + fVar103 * fVar76;
                      auVar66._12_4_ = fVar106 + fVar105 * fVar76;
                      auVar66._16_4_ = fVar108 + fVar107 * fVar76;
                      auVar66._20_4_ = fVar110 + fVar109 * fVar76;
                      auVar66._24_4_ = fVar112 + fVar111 * fVar76;
                      auVar66._28_4_ = fVar113 + fVar76;
                      auVar84._0_4_ = fVar78 + fVar80 * fVar77;
                      auVar84._4_4_ = fVar79 + fVar81 * fVar77;
                      auVar84._8_4_ = fVar104 + fVar103 * fVar77;
                      auVar84._12_4_ = fVar106 + fVar105 * fVar77;
                      auVar84._16_4_ = fVar108 + fVar107 * fVar77;
                      auVar84._20_4_ = fVar110 + fVar109 * fVar77;
                      auVar84._24_4_ = fVar112 + fVar111 * fVar77;
                      auVar84._28_4_ = fVar113 + fVar77;
                      auVar21._8_8_ = local_5c40._8_8_;
                      auVar21._0_8_ = local_5c40._0_8_;
                      auVar21._16_8_ = local_5c40._16_8_;
                      auVar21._24_8_ = local_5c40._24_8_;
                      auVar94 = vfmadd231ps_fma(ZEXT1632(auVar39),auVar21,auVar75);
                      auVar91 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar21,local_5a20);
                      auVar100 = vfmadd231ps_fma(ZEXT1632(auVar67),auVar21,local_5a00);
                      auVar43 = vrcpps_avx(auVar82);
                      auVar39 = vfnmadd213ps_fma(auVar82,auVar43,auVar51);
                      auVar82 = vrcpps_avx(auVar55);
                      auVar39 = vfmadd132ps_fma(ZEXT1632(auVar39),auVar43,auVar43);
                      auVar43 = vrcpps_avx(auVar63);
                      auVar44 = vfnmadd213ps_fma(auVar55,auVar82,auVar51);
                      auVar44 = vfmadd132ps_fma(ZEXT1632(auVar44),auVar82,auVar82);
                      auVar67 = vfnmadd213ps_fma(auVar63,auVar43,auVar51);
                      auVar67 = vfmadd132ps_fma(ZEXT1632(auVar67),auVar43,auVar43);
                      auVar43 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar94));
                      auVar116 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                    CONCAT424(0x3f7ffffa,
                                                              CONCAT420(0x3f7ffffa,
                                                                        CONCAT416(0x3f7ffffa,
                                                                                  CONCAT412(
                                                  0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)
                                                  ))))));
                      auVar82 = vsubps_avx(auVar118,ZEXT1632(auVar94));
                      auVar119 = ZEXT3264(CONCAT428(0x3f800003,
                                                    CONCAT424(0x3f800003,
                                                              CONCAT420(0x3f800003,
                                                                        CONCAT416(0x3f800003,
                                                                                  CONCAT412(
                                                  0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)
                                                  ))))));
                      auVar14._4_4_ = auVar39._4_4_ * auVar43._4_4_;
                      auVar14._0_4_ = auVar39._0_4_ * auVar43._0_4_;
                      auVar14._8_4_ = auVar39._8_4_ * auVar43._8_4_;
                      auVar14._12_4_ = auVar39._12_4_ * auVar43._12_4_;
                      auVar14._16_4_ = auVar43._16_4_ * 0.0;
                      auVar14._20_4_ = auVar43._20_4_ * 0.0;
                      auVar14._24_4_ = auVar43._24_4_ * 0.0;
                      auVar14._28_4_ = auVar43._28_4_;
                      auVar15._4_4_ = auVar39._4_4_ * auVar82._4_4_;
                      auVar15._0_4_ = auVar39._0_4_ * auVar82._0_4_;
                      auVar15._8_4_ = auVar39._8_4_ * auVar82._8_4_;
                      auVar15._12_4_ = auVar39._12_4_ * auVar82._12_4_;
                      auVar15._16_4_ = auVar82._16_4_ * 0.0;
                      auVar15._20_4_ = auVar82._20_4_ * 0.0;
                      auVar15._24_4_ = auVar82._24_4_ * 0.0;
                      auVar15._28_4_ = auVar82._28_4_;
                      auVar43 = vsubps_avx(ZEXT1632(auVar96),ZEXT1632(auVar91));
                      auVar82 = vsubps_avx(auVar66,ZEXT1632(auVar91));
                      auVar16._4_4_ = auVar44._4_4_ * auVar43._4_4_;
                      auVar16._0_4_ = auVar44._0_4_ * auVar43._0_4_;
                      auVar16._8_4_ = auVar44._8_4_ * auVar43._8_4_;
                      auVar16._12_4_ = auVar44._12_4_ * auVar43._12_4_;
                      auVar16._16_4_ = auVar43._16_4_ * 0.0;
                      auVar16._20_4_ = auVar43._20_4_ * 0.0;
                      auVar16._24_4_ = auVar43._24_4_ * 0.0;
                      auVar16._28_4_ = auVar66._28_4_;
                      auVar17._4_4_ = auVar44._4_4_ * auVar82._4_4_;
                      auVar17._0_4_ = auVar44._0_4_ * auVar82._0_4_;
                      auVar17._8_4_ = auVar44._8_4_ * auVar82._8_4_;
                      auVar17._12_4_ = auVar44._12_4_ * auVar82._12_4_;
                      auVar17._16_4_ = auVar82._16_4_ * 0.0;
                      auVar17._20_4_ = auVar82._20_4_ * 0.0;
                      auVar17._24_4_ = auVar82._24_4_ * 0.0;
                      auVar17._28_4_ = auVar82._28_4_;
                      auVar43 = vsubps_avx(ZEXT1632(auVar93),ZEXT1632(auVar100));
                      auVar18._4_4_ = auVar67._4_4_ * auVar43._4_4_;
                      auVar18._0_4_ = auVar67._0_4_ * auVar43._0_4_;
                      auVar18._8_4_ = auVar67._8_4_ * auVar43._8_4_;
                      auVar18._12_4_ = auVar67._12_4_ * auVar43._12_4_;
                      auVar18._16_4_ = auVar43._16_4_ * 0.0;
                      auVar18._20_4_ = auVar43._20_4_ * 0.0;
                      auVar18._24_4_ = auVar43._24_4_ * 0.0;
                      auVar18._28_4_ = auVar43._28_4_;
                      auVar43 = vsubps_avx(auVar84,ZEXT1632(auVar100));
                      auVar42._0_4_ = auVar67._0_4_ * auVar43._0_4_;
                      auVar42._4_4_ = auVar67._4_4_ * auVar43._4_4_;
                      auVar42._8_4_ = auVar67._8_4_ * auVar43._8_4_;
                      auVar42._12_4_ = auVar67._12_4_ * auVar43._12_4_;
                      auVar42._16_4_ = auVar43._16_4_ * 0.0;
                      auVar42._20_4_ = auVar43._20_4_ * 0.0;
                      auVar42._24_4_ = auVar43._24_4_ * 0.0;
                      auVar42._28_4_ = 0;
                      auVar43 = vpminsd_avx2(auVar14,auVar15);
                      auVar82 = vpminsd_avx2(auVar16,auVar17);
                      auVar43 = vpmaxsd_avx2(auVar43,auVar82);
                      auVar82 = vpminsd_avx2(auVar18,auVar42);
                      auVar43 = vpmaxsd_avx2(auVar43,auVar82);
                      auVar85 = ZEXT3264(CONCAT428(0x7f800000,
                                                   CONCAT424(0x7f800000,
                                                             CONCAT420(0x7f800000,
                                                                       CONCAT416(0x7f800000,
                                                                                 CONCAT412(
                                                  0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                  ))))));
                      auVar82 = vpmaxsd_avx2(auVar14,auVar15);
                      auVar55 = vpmaxsd_avx2(auVar16,auVar17);
                      auVar55 = vpminsd_avx2(auVar82,auVar55);
                      auVar82 = vpmaxsd_avx2(auVar18,auVar42);
                      auVar82 = vpminsd_avx2(auVar55,auVar82);
                      auVar52._4_4_ = auVar43._4_4_ * 0.99999964;
                      auVar52._0_4_ = auVar43._0_4_ * 0.99999964;
                      auVar52._8_4_ = auVar43._8_4_ * 0.99999964;
                      auVar52._12_4_ = auVar43._12_4_ * 0.99999964;
                      auVar52._16_4_ = auVar43._16_4_ * 0.99999964;
                      auVar52._20_4_ = auVar43._20_4_ * 0.99999964;
                      auVar52._24_4_ = auVar43._24_4_ * 0.99999964;
                      auVar52._28_4_ = auVar55._28_4_;
                      auVar19._4_4_ = auVar82._4_4_ * 1.0000004;
                      auVar19._0_4_ = auVar82._0_4_ * 1.0000004;
                      auVar19._8_4_ = auVar82._8_4_ * 1.0000004;
                      auVar19._12_4_ = auVar82._12_4_ * 1.0000004;
                      auVar19._16_4_ = auVar82._16_4_ * 1.0000004;
                      auVar19._20_4_ = auVar82._20_4_ * 1.0000004;
                      auVar19._24_4_ = auVar82._24_4_ * 1.0000004;
                      auVar19._28_4_ = auVar82._28_4_;
                      auVar43 = vpmaxsd_avx2(auVar52,local_5ac0);
                      auVar82 = vpminsd_avx2(auVar19,local_5aa0);
                      auVar82 = vcmpps_avx(auVar43,auVar82,2);
                      fStack_59dc = local_59e0;
                      fStack_59d8 = local_59e0;
                      fStack_59d4 = local_59e0;
                      fStack_59d0 = local_59e0;
                      fStack_59cc = local_59e0;
                      fStack_59c8 = local_59e0;
                      fStack_59c4 = local_59e0;
LAB_0069ccfc:
                      auVar39 = auVar82._0_16_;
                      auVar44 = auVar82._16_16_;
                    }
                    auVar39 = vpackssdw_avx(auVar39,auVar44);
                    auVar44 = vpackssdw_avx(auVar1._0_16_,auVar1._16_16_);
                    auVar39 = vpand_avx(auVar39,auVar44);
                    auVar43 = vpmovzxwd_avx2(auVar39);
                    auVar43 = vpslld_avx2(auVar43,0x1f);
                    if ((((((((auVar43 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar43 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar43 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar43 >> 0x7f,0) == '\0') &&
                          (auVar43 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar43 >> 0xbf,0) == '\0') &&
                        (auVar43 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar43[0x1f]) {
                      auVar48 = ZEXT3264(auVar48._0_32_);
                    }
                    else {
                      auVar43 = vblendvps_avx(auVar85._0_32_,auVar52,auVar43);
                      if (root.ptr != 8) {
                        *puVar36 = root.ptr;
                        puVar36 = puVar36 + 1;
                        local_5ce0 = auVar48._0_8_;
                        uStack_5cd8 = auVar48._8_8_;
                        uStack_5cd0 = auVar48._16_8_;
                        uStack_5cc8 = auVar48._24_8_;
                        *(undefined8 *)*pauVar37 = local_5ce0;
                        *(undefined8 *)(*pauVar37 + 8) = uStack_5cd8;
                        *(undefined8 *)(*pauVar37 + 0x10) = uStack_5cd0;
                        *(undefined8 *)(*pauVar37 + 0x18) = uStack_5cc8;
                        pauVar37 = pauVar37 + 1;
                      }
                      auVar48 = ZEXT3264(auVar43);
                      root.ptr = uVar2;
                    }
                  }
                } while ((uVar2 != 8) && (bVar38 = uVar33 < 7, uVar33 = uVar33 + 1, bVar38));
                iVar27 = 0;
                if (root.ptr == 8) {
LAB_0069cdba:
                  pRVar34 = (RayQueryContext *)0x0;
                  iVar27 = 4;
                }
                else {
                  auVar1 = vcmpps_avx(local_5aa0,auVar48._0_32_,6);
                  uVar31 = vmovmskps_avx(auVar1);
                  pRVar34 = (RayQueryContext *)0x1;
                  if ((uint)POPCOUNT(uVar31) <= uVar30) {
                    *puVar36 = root.ptr;
                    puVar36 = puVar36 + 1;
                    *pauVar37 = auVar48._0_32_;
                    pauVar37 = pauVar37 + 1;
                    goto LAB_0069cdba;
                  }
                }
              } while ((char)pRVar34 != '\0');
            }
          }
        }
      } while (iVar27 != 3);
      auVar1 = vandps_avx(local_5a60,local_5c80);
      auVar47._8_4_ = 0xff800000;
      auVar47._0_8_ = 0xff800000ff800000;
      auVar47._12_4_ = 0xff800000;
      auVar47._16_4_ = 0xff800000;
      auVar47._20_4_ = 0xff800000;
      auVar47._24_4_ = 0xff800000;
      auVar47._28_4_ = 0xff800000;
      auVar1 = vmaskmovps_avx(auVar1,auVar47);
      *(undefined1 (*) [32])(ray + 0x100) = auVar1;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }